

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall StringPieceUtilTestSplitStringPiece::Run(StringPieceUtilTestSplitStringPiece *this)

{
  pointer *str;
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  StringPiece local_268;
  StringPiece local_258;
  StringPiece local_248;
  StringPiece local_238;
  StringPiece local_228;
  StringPiece local_218;
  undefined1 local_208 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_4;
  undefined1 local_1e8 [8];
  string sep;
  StringPiece local_1b8;
  StringPiece local_1a8;
  undefined1 local_198 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_3;
  undefined1 local_178 [8];
  string sep_only;
  StringPiece local_148;
  undefined1 local_138 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_2;
  undefined1 local_118 [8];
  string one;
  StringPiece local_e8;
  undefined1 local_d8 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_1;
  string empty;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  undefined1 local_60 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  StringPieceUtilTestSplitStringPiece *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"a:b:c",&local_31);
  std::allocator<char>::~allocator(&local_31);
  StringPiece::StringPiece(&local_70,(string *)local_30);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,local_70,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  testing::Test::Check
            (pTVar1,sVar3 == 3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1a,"list.size() == 3");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,0);
  StringPiece::StringPiece(&local_80,"a");
  bVar2 = StringPiece::operator==(pvVar4,&local_80);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1c,"list[0] == \"a\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,1);
  StringPiece::StringPiece(&local_90,"b");
  bVar2 = StringPiece::operator==(pvVar4,&local_90);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1d,"list[1] == \"b\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,2);
  StringPiece::StringPiece((StringPiece *)((long)&empty.field_2 + 8),"c");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&empty.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x1e,"list[2] == \"c\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  str = &list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)str);
  StringPiece::StringPiece(&local_e8,(string *)str);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_d8,local_e8,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_d8);
  testing::Test::Check
            (pTVar1,sVar3 == 1,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x25,"list.size() == 1");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_d8,0);
  StringPiece::StringPiece((StringPiece *)((long)&one.field_2 + 8),"");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&one.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x27,"list[0] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_d8);
  std::__cxx11::string::~string
            ((string *)
             &list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"a",
             (allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_148,(string *)local_118);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138,local_148,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
  testing::Test::Check
            (pTVar1,sVar3 == 1,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x2e,"list.size() == 1");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138,0);
  StringPiece::StringPiece((StringPiece *)((long)&sep_only.field_2 + 8),"a");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&sep_only.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x30,"list[0] == \"a\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
  std::__cxx11::string::~string((string *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,":",
             (allocator<char> *)
             ((long)&list_3.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_3.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_1a8,(string *)local_178);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198,local_1a8,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198);
  testing::Test::Check
            (pTVar1,sVar3 == 2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x37,"list.size() == 2");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198,0);
  StringPiece::StringPiece(&local_1b8,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_1b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x39,"list[0] == \"\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198,1);
  StringPiece::StringPiece((StringPiece *)((long)&sep.field_2 + 8),"");
  bVar2 = StringPiece::operator==(pvVar4,(StringPiece *)((long)&sep.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x3a,"list[1] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198);
  std::__cxx11::string::~string((string *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,":a:b:c:",
             (allocator<char> *)
             ((long)&list_4.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_4.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_218,(string *)local_1e8);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,local_218,':');
  pTVar1 = g_current_test;
  sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208);
  testing::Test::Check
            (pTVar1,sVar3 == 5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x41,"list.size() == 5");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,0);
  StringPiece::StringPiece(&local_228,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_228);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x43,"list[0] == \"\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,1);
  StringPiece::StringPiece(&local_238,"a");
  bVar2 = StringPiece::operator==(pvVar4,&local_238);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x44,"list[1] == \"a\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,2);
  StringPiece::StringPiece(&local_248,"b");
  bVar2 = StringPiece::operator==(pvVar4,&local_248);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x45,"list[2] == \"b\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,3);
  StringPiece::StringPiece(&local_258,"c");
  bVar2 = StringPiece::operator==(pvVar4,&local_258);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x46,"list[3] == \"c\"");
  pTVar1 = g_current_test;
  pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                     ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,4);
  StringPiece::StringPiece(&local_268,"");
  bVar2 = StringPiece::operator==(pvVar4,&local_268);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x47,"list[4] == \"\"");
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  return;
}

Assistant:

TEST(StringPieceUtilTest, SplitStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ(list.size(), 3);

    EXPECT_EQ(list[0], "a");
    EXPECT_EQ(list[1], "b");
    EXPECT_EQ(list[2], "c");
  }

  {
    string empty;
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "");
  }

  {
    string one("a");
    vector<StringPiece> list = SplitStringPiece(one, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "a");
  }

  {
    string sep_only(":");
    vector<StringPiece> list = SplitStringPiece(sep_only, ':');

    EXPECT_EQ(list.size(), 2);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "");
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(list.size(), 5);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "a");
    EXPECT_EQ(list[2], "b");
    EXPECT_EQ(list[3], "c");
    EXPECT_EQ(list[4], "");
  }
}